

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

iterator __thiscall
ImVector<ImGuiStorage::Pair>::insert
          (ImVector<ImGuiStorage::Pair> *this,const_iterator it,value_type *v)

{
  int iVar1;
  anon_union_8_3_a9ee5d6f_for_Pair_1 aVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int new_capacity;
  const_iterator pvVar6;
  
  pvVar6 = this->Data;
  if (pvVar6 <= it) {
    iVar1 = this->Size;
    lVar3 = (long)iVar1;
    if (it <= pvVar6 + lVar3) {
      lVar5 = (long)it - (long)pvVar6;
      if (iVar1 == this->Capacity) {
        new_capacity = 4;
        if (iVar1 != 0) {
          new_capacity = iVar1 * 2;
        }
        reserve(this,new_capacity);
        lVar3 = (long)this->Size;
        pvVar6 = this->Data;
      }
      lVar4 = lVar3 - (lVar5 >> 4);
      if (lVar4 != 0 && lVar5 >> 4 <= lVar3) {
        memmove((void *)((long)pvVar6 + lVar5 + 0x10),(void *)((long)pvVar6 + lVar5),lVar4 * 0x10);
        pvVar6 = this->Data;
      }
      aVar2 = v->field_1;
      *(undefined8 *)((long)pvVar6 + lVar5) = *(undefined8 *)v;
      *(anon_union_8_3_a9ee5d6f_for_Pair_1 *)((undefined8 *)((long)pvVar6 + lVar5) + 1) = aVar2;
      this->Size = this->Size + 1;
      return (iterator)(lVar5 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                ,0x3ab,
                "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
               );
}

Assistant:

inline iterator             insert(const_iterator it, const value_type& v)  { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(Capacity ? Capacity * 2 : 4); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(value_type)); Data[off] = v; Size++; return Data + off; }